

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QList<QString> * __thiscall
QMap<QString,_QList<QString>_>::value
          (QMap<QString,_QList<QString>_> *this,QString *key,QList<QString> *defaultValue)

{
  bool bVar1;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  const_iterator i;
  map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>
  *in_stack_ffffffffffffffa8;
  QList<QString> *this_00;
  _Self local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
                      *)0x1168a6);
  if (bVar1) {
    local_10._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
                  *)0x1168d4);
    local_10._M_node =
         (_Base_ptr)
         std::
         map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>
         ::find(in_stack_ffffffffffffffa8,(key_type *)0x1168e5);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
                  *)0x1168f4);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>
         ::cend(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(&local_10,&local_18);
    if (bVar1) {
      std::_Rb_tree_const_iterator<std::pair<const_QString,_QList<QString>_>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_QString,_QList<QString>_>_> *)0x116924);
      QList<QString>::QList(this_00,(QList<QString> *)in_stack_ffffffffffffffa8);
    }
    else {
      QList<QString>::QList(this_00,(QList<QString> *)in_stack_ffffffffffffffa8);
    }
  }
  else {
    QList<QString>::QList(this_00,(QList<QString> *)in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }